

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Peers::ip2Peers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Peers *this,string *ip)

{
  const_iterator cVar1;
  mapped_type *__x;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::find(&(this->m_ip2PeerMap)._M_t,ip);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_ip2PeerMap)._M_t._M_impl.super__Rb_tree_header)
  {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::at(&this->m_ip2PeerMap,ip);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Peers::ip2Peers(const std::string &ip) const
{
    auto retItr = m_ip2PeerMap.find(ip);
    if (retItr != m_ip2PeerMap.end())
        return m_ip2PeerMap.at(ip);
    return {};
}